

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintStatement.h
# Opt level: O0

void __thiscall PrintStatement::execute(PrintStatement *this,Environment *env)

{
  bool bVar1;
  ThrowPacket *pTVar2;
  element_type *peVar3;
  element_type *peVar4;
  string local_c8 [38];
  undefined1 local_a2;
  allocator<char> local_a1;
  string local_a0;
  ptr<Value> local_80;
  undefined1 local_70 [8];
  ptr<Value> value;
  allocator<char> local_49;
  string local_48;
  ptr<Value> local_28;
  Environment *local_18;
  Environment *env_local;
  PrintStatement *this_local;
  
  local_18 = env;
  env_local = (Environment *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->expression);
  if (!bVar1) {
    value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 1;
    pTVar2 = (ThrowPacket *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Value is null",&local_49);
    ExceptionObjects::null_value((ExceptionObjects *)&local_28,&local_48);
    ThrowPacket::ThrowPacket(pTVar2,&local_28);
    value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 0;
    __cxa_throw(pTVar2,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
  }
  peVar3 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->expression);
  (**peVar3->_vptr_Expression)(local_70,peVar3,local_18);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_70);
  if (!bVar1) {
    local_a2 = 1;
    pTVar2 = (ThrowPacket *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"Value is null",&local_a1);
    ExceptionObjects::null_value((ExceptionObjects *)&local_80,&local_a0);
    ThrowPacket::ThrowPacket(pTVar2,&local_80);
    local_a2 = 0;
    __cxa_throw(pTVar2,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
  }
  peVar4 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_70);
  (*(peVar4->super_Member)._vptr_Member[2])(local_c8);
  std::operator<<((ostream *)&std::cout,local_c8);
  std::__cxx11::string::~string(local_c8);
  std::shared_ptr<Value>::~shared_ptr((shared_ptr<Value> *)local_70);
  return;
}

Assistant:

void execute(Environment *env) override {
        if(!expression)
            throw ThrowPacket(ExceptionObjects::null_value("Value is null"));
        ptr<Value> value = expression -> evaluate(env);
        if(!value)
            throw ThrowPacket(ExceptionObjects::null_value("Value is null"));

        std::cout << value -> asString();
    }